

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O0

void __thiscall runtime::VirtualMachine::printFunction(VirtualMachine *this,Function *fn)

{
  ulong uVar1;
  size_t sVar2;
  ostream *poVar3;
  size_type sVar4;
  const_reference pvVar5;
  const_reference pvVar6;
  ByteCode bc;
  string local_48;
  ulong local_28;
  size_t i_1;
  size_t i;
  Function *fn_local;
  VirtualMachine *this_local;
  
  i = (size_t)fn;
  fn_local = (Function *)this;
  poVar3 = std::operator<<(this->out,"| | Argument Count: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(ulong *)i);
  std::operator<<(poVar3,'\n');
  poVar3 = std::operator<<(this->out,"| | Local Count: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(ulong *)(i + 8));
  std::operator<<(poVar3,'\n');
  std::operator<<(this->out,"| | Capture Contexts:\n");
  i_1 = 0;
  while( true ) {
    sVar2 = i_1;
    sVar4 = std::vector<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>::size
                      ((vector<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>
                        *)(i + 0x10));
    if (sVar4 <= sVar2) break;
    poVar3 = std::operator<<(this->out,"| |   |");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,i_1);
    poVar3 = std::operator<<(poVar3,"| ClosureContext(scopeOffsets:");
    pvVar5 = std::vector<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>::at
                       ((vector<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>
                         *)(i + 0x10),i_1);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,pvVar5->scopeOffsets);
    poVar3 = std::operator<<(poVar3,", LocalIndex: ");
    pvVar5 = std::vector<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>::at
                       ((vector<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>
                         *)(i + 0x10),i_1);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,pvVar5->localIndex);
    poVar3 = std::operator<<(poVar3,")");
    std::operator<<(poVar3,'\n');
    i_1 = i_1 + 1;
  }
  std::operator<<(this->out,"| | Byte Code:\n");
  local_28 = 0;
  while( true ) {
    uVar1 = local_28;
    sVar4 = std::vector<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>::size
                      ((vector<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_> *)(i + 0x28)
                      );
    if (sVar4 <= uVar1) break;
    poVar3 = std::operator<<(this->out,"| |   |");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_28);
    poVar3 = std::operator<<(poVar3,"| ");
    pvVar6 = std::vector<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>::at
                       ((vector<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_> *)
                        (i + 0x28),local_28);
    bc._0_8_ = *(ulong *)pvVar6 & 0xffffffff;
    bc.parameter = pvVar6->parameter;
    byteCodeToString_abi_cxx11_(&local_48,this,bc,false);
    poVar3 = std::operator<<(poVar3,(string *)&local_48);
    std::operator<<(poVar3,'\n');
    std::__cxx11::string::~string((string *)&local_48);
    local_28 = local_28 + 1;
  }
  std::operator<<(this->out,"| \\------------------\n");
  return;
}

Assistant:

void runtime::VirtualMachine::printFunction(const bytecode::Function* fn) {
  this->out << "| | Argument Count: " << fn->argumentCount << '\n';
  this->out << "| | Local Count: " << fn->localsCount << '\n';
  this->out << "| | Capture Contexts:\n";
  for (std::size_t i = 0; i < fn->closures.size(); i++) {
    this->out << "| |   |" << i << "| ClosureContext(scopeOffsets:" << fn->closures.at(i).scopeOffsets << ", LocalIndex: " << fn->closures.at(i).localIndex << ")" << '\n';
  }
  this->out << "| | Byte Code:\n";
  for (std::size_t i = 0; i < fn->byteCode.size(); i++) {
    this->out << "| |   |" << i << "| " << this->byteCodeToString(fn->byteCode.at(i), false) << '\n';
  }
  this->out << "| \\------------------\n";
}